

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

string * __thiscall
deqp::gls::BuiltinPrecisionTests::intervalToString<tcu::Matrix<float,4,4>>
          (string *__return_storage_ptr__,BuiltinPrecisionTests *this,FloatFormat *fmt,IVal *ival)

{
  ostringstream oss;
  ostringstream local_310 [112];
  ios_base local_2a0 [264];
  Matrix<tcu::Interval,_4,_4> local_198;
  
  std::__cxx11::ostringstream::ostringstream(local_310);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix(&local_198,(Matrix<tcu::Interval,_4,_4> *)fmt);
  ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doPrintIVal
            ((FloatFormat *)this,&local_198,(ostream *)local_310);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_310);
  std::ios_base::~ios_base(local_2a0);
  return __return_storage_ptr__;
}

Assistant:

string intervalToString (const FloatFormat& fmt, const typename Traits<T>::IVal& ival)
{
	ostringstream oss;
	printIVal<T>(fmt, ival, oss);
	return oss.str();
}